

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDisc_dns.c
# Opt level: O2

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *f_data)

{
  double dVar1;
  
  if (*f_data == 2) {
    dVar1 = **(double **)((long)y->content + 0x10) * -5.0;
  }
  else {
    if (*f_data != 1) {
      return 0;
    }
    dVar1 = -**(double **)((long)y->content + 0x10);
  }
  **(double **)((long)ydot->content + 0x10) = dVar1;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* f_data)
{
  int* flag;

  flag = (int*)f_data;

  switch (*flag)
  {
  case RHS1: NV_Ith_S(ydot, 0) = -NV_Ith_S(y, 0); break;
  case RHS2: NV_Ith_S(ydot, 0) = -5.0 * NV_Ith_S(y, 0); break;
  }

  return (0);
}